

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O2

void __thiscall
ANN::ANN(ANN *this,ANNpointArray points,int n1,int n2,int size,int dim,int *topology,
        ANNpoint scaling,int NumNeighbors)

{
  int iVar1;
  int dd;
  ostream *poVar2;
  ANNpoint pAVar3;
  ANNpointArray pa;
  ANNidxArray pAVar4;
  ANNdistArray pAVar5;
  int *piVar6;
  ANNkd_tree *this_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  
  iVar1 = anncount + 1;
  bVar12 = anncount == 0;
  anncount = iVar1;
  if (bVar12) {
    poVar2 = std::operator<<((ostream *)&std::cout,"MPNN library");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  this->numPoints = size;
  this->dimension = dim;
  pAVar3 = annAllocPt(dim,0.0);
  this->query_pt = pAVar3;
  pa = annAllocPts(this->numPoints,this->dimension);
  this->data_pts = pa;
  uVar9 = (long)NumNeighbors * 4;
  if (NumNeighbors < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar11 = (long)NumNeighbors * 8;
  if (NumNeighbors < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  pAVar4 = (ANNidxArray)operator_new__(uVar9);
  this->nn_idx = pAVar4;
  pAVar5 = (ANNdistArray)operator_new__(uVar11);
  this->dists = pAVar5;
  this->epsilon = 0.0;
  iVar1 = this->numPoints;
  uVar9 = (long)iVar1 * 4;
  if ((long)iVar1 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar6 = (int *)operator_new__(uVar9);
  this->node_indices = piVar6;
  dd = this->dimension;
  lVar8 = 0;
  for (lVar7 = (long)n1; lVar7 != n2; lVar7 = lVar7 + 1) {
    piVar6[lVar8] = (int)lVar7;
    for (lVar10 = 0; lVar10 < dd; lVar10 = lVar10 + 1) {
      pa[lVar8][lVar10] = scaling[lVar10] * points[lVar7][lVar10];
    }
    lVar8 = lVar8 + 1;
  }
  this_00 = (ANNkd_tree *)operator_new(0x50);
  ANNkd_tree::ANNkd_tree(this_00,pa,iVar1,dd,scaling,topology,1,ANN_KD_SUGGEST);
  this->the_tree = this_00;
  return;
}

Assistant:

ANN::ANN(ANNpointArray points, int n1, int n2, int size, int dim, int *topology,
         ANNpoint scaling, int NumNeighbors) {
    int n = 0, i = 0, j = 0;

    anncount++;
    if (anncount == 1) std::cout << "MPNN library" << std::endl;

    numPoints = size;
    dimension = dim;

    query_pt = annAllocPt(dimension);              // allocate query point
    data_pts = annAllocPts(numPoints, dimension);  // allocate data points
    nn_idx = new ANNidx[NumNeighbors];  // allocate near neighbor indices
    dists = new ANNdist[NumNeighbors];  // allocate near neighbor dists
    epsilon = 0.0;

    node_indices = new int[numPoints];  // allocate indices of the points

    // Copy nodes to data_pts
    i = 0;
    for (n = n1; n != n2; n++) {
        node_indices[i] = n;
        for (j = 0; j < dimension; j++) {
            data_pts[i][j] = scaling[j] * points[n][j];
        }
        i++;
    }

    // Initialize ANN
    the_tree = new ANNkd_tree(data_pts,   // the data points
                              numPoints,  // number of points
                              dimension,  // dimension of space
                              scaling,    // scaling of the coordinates
                              topology);  // topology of the space
}